

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.hpp
# Opt level: O1

int linenoise::unicodePrevGraphemeLen(char *buf,int pos)

{
  ulong *puVar1;
  byte bVar2;
  int iVar3;
  byte *pbVar4;
  uint uVar5;
  uint uVar6;
  int end;
  int iVar7;
  int iVar8;
  long lVar9;
  bool bVar10;
  
  iVar7 = pos;
  if (pos != 0) {
    while (0 < iVar7) {
      if (iVar7 < 1) {
        iVar3 = -1;
      }
      else {
        iVar3 = iVar7 + -1;
      }
      iVar8 = iVar7 - iVar3;
      if (iVar7 == iVar3) {
LAB_00146861:
        uVar6 = 0;
      }
      else {
        pbVar4 = (byte *)(buf + iVar3);
        bVar2 = *pbVar4;
        uVar6 = (uint)bVar2;
        if ((char)bVar2 < '\0') {
          uVar5 = (uint)bVar2;
          if ((uVar6 & 0xffffffe0) == 0xc0) {
            uVar6 = 0;
            if (1 < iVar8) {
              uVar6 = (uVar5 & 0x1f) << 6;
              lVar9 = 1;
LAB_0014693c:
              uVar6 = pbVar4[lVar9] & 0x3f | uVar6;
            }
          }
          else if ((uVar5 & 0xfffffff0) == 0xe0) {
            uVar6 = 0;
            if (2 < iVar8) {
              uVar6 = (uVar5 & 0xf) << 0xc | (pbVar4[1] & 0x3f) << 6;
              lVar9 = 2;
              goto LAB_0014693c;
            }
          }
          else {
            if (iVar8 < 4) goto LAB_00146861;
            uVar6 = 0;
            if ((uVar5 & 0xfffffff8) == 0xf0) {
              uVar6 = (pbVar4[2] & 0x3f) << 6 | (pbVar4[1] & 0x3f) << 0xc | (uVar5 & 7) << 0x12;
              lVar9 = 3;
              goto LAB_0014693c;
            }
          }
        }
      }
      lVar9 = 0;
      do {
        puVar1 = (ulong *)((long)&unicodeCombiningCharTable + lVar9);
        if (*puVar1 == (ulong)uVar6) break;
        bVar10 = lVar9 != 0x30f0;
        lVar9 = lVar9 + 8;
      } while (bVar10);
      iVar7 = iVar3;
      if (*puVar1 != (ulong)uVar6) {
        return pos - iVar3;
      }
    }
  }
  return 0;
}

Assistant:

inline int unicodePrevGraphemeLen(char* buf, int pos)
{
    if (pos == 0) {
        return 0;
    }
    int end = pos;
    while (pos > 0) {
        int len = unicodePrevUTF8CharLen(buf, pos);
        pos -= len;
        int cp = 0;
        unicodeUTF8CharToCodePoint(buf + pos, len, &cp);
        if (!unicodeIsCombiningChar(cp)) {
            return end - pos;
        }
    }
    return 0;
}